

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,int *_woffset,int *_hoffset,int *_doffset,int *_coffset,
          int *_outw,int *_outh,int *_outd,int *_outc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  int local_48 [6];
  int _axes [4];
  
  uVar1 = bottom_blob->dims;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  pvVar7 = (this->starts).data;
  if ((((pvVar7 != (void *)0x0) && ((long)(this->starts).c * (this->starts).cstep != 0)) &&
      (pvVar8 = (this->ends).data, pvVar8 != (void *)0x0)) &&
     ((long)(this->ends).c * (this->ends).cstep != 0)) {
    *_woffset = 0;
    *_hoffset = 0;
    *_doffset = 0;
    *_coffset = 0;
    *_outw = uVar2;
    *_outh = uVar3;
    *_outd = uVar4;
    *_outc = uVar5;
    pvVar9 = (this->axes).data;
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    uVar6 = (this->axes).w;
    uVar12 = uVar1;
    if ((ulong)uVar6 != 0) {
      if ((int)uVar6 < 1) {
        return;
      }
      uVar13 = 0;
      do {
        iVar10 = *(int *)((long)pvVar9 + uVar13 * 4);
        local_48[uVar13] = (iVar10 >> 0x1f & uVar1) + iVar10;
        uVar13 = uVar13 + 1;
        uVar12 = uVar6;
      } while (uVar6 != uVar13);
    }
    if ((int)uVar12 < 1) {
      return;
    }
    uVar13 = 0;
    do {
      if (uVar1 - 1 < 4) {
        iVar10 = local_48[uVar13];
        iVar20 = *(int *)((long)pvVar7 + uVar13 * 4);
        uVar6 = *(uint *)((long)pvVar8 + uVar13 * 4);
        piVar15 = _woffset;
        piVar19 = _outw;
        uVar17 = uVar2;
        switch(uVar1) {
        case 2:
          piVar15 = _hoffset;
          piVar14 = _woffset;
          piVar19 = _outh;
          piVar18 = _outw;
          uVar17 = uVar3;
          uVar16 = uVar2;
          if (iVar10 != 0) {
LAB_0025a1f1:
            piVar15 = piVar14;
            piVar19 = piVar18;
            uVar17 = uVar16;
            if (iVar10 != 1) goto switchD_0025a222_default;
          }
          break;
        case 3:
          piVar15 = _coffset;
          piVar19 = _outc;
          uVar17 = uVar5;
          if ((iVar10 != 0) &&
             (piVar15 = _woffset, piVar14 = _hoffset, piVar19 = _outw, piVar18 = _outh,
             uVar17 = uVar2, uVar16 = uVar3, iVar10 != 2)) goto LAB_0025a1f1;
          break;
        case 4:
          piVar15 = _coffset;
          piVar19 = _outc;
          uVar17 = uVar5;
          switch(iVar10) {
          case 0:
            break;
          case 1:
            piVar15 = _doffset;
            piVar19 = _outd;
            uVar17 = uVar4;
            break;
          case 2:
            piVar15 = _hoffset;
            piVar19 = _outh;
            uVar17 = uVar3;
            break;
          case 3:
            piVar15 = _woffset;
            piVar19 = _outw;
            uVar17 = uVar2;
            break;
          default:
            goto switchD_0025a222_default;
          }
        }
        if (iVar20 == -0xe9) {
          iVar20 = 0;
        }
        if (uVar6 == 0xffffff17) {
          uVar6 = uVar17;
        }
        iVar20 = (iVar20 >> 0x1f & uVar17) + iVar20;
        *piVar15 = iVar20;
        uVar16 = 0;
        if ((int)uVar6 < 1) {
          uVar16 = uVar17;
        }
        uVar11 = uVar16 + uVar6;
        if ((int)uVar17 <= (int)(uVar16 + uVar6)) {
          uVar11 = uVar17;
        }
        *piVar19 = uVar11 - iVar20;
      }
switchD_0025a222_default:
      uVar13 = uVar13 + 1;
      if (uVar12 == uVar13) {
        return;
      }
    } while( true );
  }
  *_woffset = this->woffset;
  *_hoffset = this->hoffset;
  *_doffset = this->doffset;
  *_coffset = this->coffset;
  *_outw = uVar2;
  *_outh = uVar3;
  *_outd = uVar4;
  *_outc = uVar5;
  switch(uVar1) {
  case 1:
    iVar20 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar20;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outw = iVar10;
    }
    break;
  case 2:
    iVar20 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar20;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outw = iVar10;
    }
    iVar20 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar20;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outh = iVar10;
    }
    break;
  case 3:
    iVar20 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar20;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outw = iVar10;
    }
    iVar20 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar20;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outh = iVar10;
    }
    goto LAB_0025a3e1;
  case 4:
    iVar20 = uVar2 - (this->woffset + this->woffset2);
    *_outw = iVar20;
    iVar10 = this->outw;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outw = iVar10;
    }
    iVar20 = uVar3 - (this->hoffset + this->hoffset2);
    *_outh = iVar20;
    iVar10 = this->outh;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outh = iVar10;
    }
    iVar20 = uVar4 - (this->doffset + this->doffset2);
    *_outd = iVar20;
    iVar10 = this->outd;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outd = iVar10;
    }
LAB_0025a3e1:
    iVar20 = uVar5 - (this->coffset + this->coffset2);
    *_outc = iVar20;
    iVar10 = this->outc;
    if (iVar10 != -0xe9) {
      if (iVar20 < iVar10) {
        iVar10 = iVar20;
      }
      *_outc = iVar10;
    }
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _doffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0, 1, 2, 3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims;
        }
        else
        {
            for (int i = 0; i < num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + axis;
                _axes[i] = axis;
            }
        }

        for (int i = 0; i < num_axis; i++)
        {
            int axis = _axes[i];
            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 0
            {
                if (start == -233) start = 0;
                if (end == -233) end = w;
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 4)
            {
                if (axis == 0)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = channels;
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 1)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = d;
                    _doffset = start >= 0 ? start : d + start;
                    _outd = std::min(d, end > 0 ? end : d + end) - _doffset;
                }
                if (axis == 2)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = h;
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _hoffset;
                }
                if (axis == 3)
                {
                    if (start == -233) start = 0;
                    if (end == -233) end = w;
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = w;
        _outh = h;
        _outd = d;
        _outc = channels;

        if (dims == 1)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);
        }
        if (dims == 2)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);
        }
        if (dims == 3)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
        if (dims == 4)
        {
            _outw = w - woffset - woffset2;
            if (outw != -233)
                _outw = std::min(outw, _outw);

            _outh = h - hoffset - hoffset2;
            if (outh != -233)
                _outh = std::min(outh, _outh);

            _outd = d - doffset - doffset2;
            if (outd != -233)
                _outd = std::min(outd, _outd);

            _outc = channels - coffset - coffset2;
            if (outc != -233)
                _outc = std::min(outc, _outc);
        }
    }
}